

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausSelectClauses(Clu_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int *__ptr;
  int Entry;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  uint uVar5;
  ulong uVar6;
  
  if (p->vClauses->nSize <= p->nClausesMax) {
    __assert_fail("Vec_IntSize(p->vClauses) > p->nClausesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0x161,"int Fra_ClausSelectClauses(Clu_Man_t *)");
  }
  uVar6 = (long)p->nSimWords << 5;
  uVar1 = (uint)uVar6;
  __ptr = (int *)calloc(1,(long)p->nSimWords * 0x80 + 4);
  iVar3 = 0;
  while( true ) {
    p_00 = p->vCosts;
    iVar2 = p_00->nSize;
    if (iVar2 <= iVar3) break;
    iVar2 = Vec_IntEntry(p_00,iVar3);
    if (iVar2 != -1) {
      if ((int)uVar1 < iVar2) {
        __assert_fail("Cost < CostMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                      ,0x16a,"int Fra_ClausSelectClauses(Clu_Man_t *)");
      }
      __ptr[iVar2] = __ptr[iVar2] + 1;
    }
    iVar3 = iVar3 + 1;
  }
  if (*__ptr != 0) {
    __assert_fail("pCostCount[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0x16d,"int Fra_ClausSelectClauses(Clu_Man_t *)");
  }
  iVar3 = 0;
  while (uVar5 = (uint)uVar6, uVar4 = (int)uVar1 >> 0x1f & uVar1, 0 < (int)uVar5) {
    if (__ptr[uVar6 & 0xffffffff] < 0) {
      __assert_fail("pCostCount[c] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                    ,0x172,"int Fra_ClausSelectClauses(Clu_Man_t *)");
    }
    iVar3 = iVar3 + __ptr[uVar6 & 0xffffffff];
    uVar4 = uVar5;
    if (p->nClausesMax <= iVar3) break;
    uVar6 = (ulong)(uVar5 - 1);
  }
  uVar5 = 0;
  for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar3);
    if ((iVar2 < (int)uVar4) || (p->nClausesMax <= (int)uVar5)) {
      Vec_IntWriteEntry(p->vCosts,iVar3,Entry);
    }
    else {
      uVar5 = uVar5 + 1;
    }
    p_00 = p->vCosts;
    iVar2 = p_00->nSize;
  }
  free(__ptr);
  p->nClauses = uVar5;
  if (p->fVerbose != 0) {
    printf("Selected %d clauses. Cost range: [%d < %d < %d]\n",(ulong)uVar5,1,(ulong)uVar4,
           (ulong)(uVar1 + 1));
  }
  return uVar4;
}

Assistant:

int Fra_ClausSelectClauses( Clu_Man_t * p )
{
    int * pCostCount, nClauCount, Cost, CostMax, i, c;
    assert( Vec_IntSize(p->vClauses) > p->nClausesMax );   
    // count how many implications have each cost
    CostMax = p->nSimWords * 32 + 1;
    pCostCount = ABC_ALLOC( int, CostMax );
    memset( pCostCount, 0, sizeof(int) * CostMax );
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost == -1 )
            continue;
        assert( Cost < CostMax );
        pCostCount[ Cost ]++;
    }
    assert( pCostCount[0] == 0 );
    // select the bound on the cost (above this bound, implication will be included)
    nClauCount = 0;
    for ( c = CostMax - 1; c > 0; c-- )
    {
        assert( pCostCount[c] >= 0 );
        nClauCount += pCostCount[c];
        if ( nClauCount >= p->nClausesMax )
            break;
    }
    // collect implications with the given costs
    nClauCount = 0;
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost >= c && nClauCount < p->nClausesMax )
        {
            nClauCount++;
            continue;
        }
        Vec_IntWriteEntry( p->vCosts, i, -1 );
    }
    ABC_FREE( pCostCount );
    p->nClauses = nClauCount;
if ( p->fVerbose )
printf( "Selected %d clauses. Cost range: [%d < %d < %d]\n", nClauCount, 1, c, CostMax );
    return c;
}